

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O3

ByteArray * __thiscall
ByteArray::mid(ByteArray *__return_storage_ptr__,ByteArray *this,size_t start,ssize_t length)

{
  size_t neededSize;
  
  __return_storage_ptr__->data_ = (byte *)0x0;
  __return_storage_ptr__->size_ = 0;
  __return_storage_ptr__->allocatedSize_ = 0;
  neededSize = this->size_ - start;
  if (start <= this->size_ && neededSize != 0) {
    if (-1 < length) {
      neededSize = length;
    }
    grow(__return_storage_ptr__,neededSize);
    __return_storage_ptr__->size_ = neededSize;
    memcpy(__return_storage_ptr__->data_,this->data_ + start,neededSize);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray ByteArray::mid(size_t start, ssize_t length)
{
	ByteArray ret;

	if (length < 0)
		length = size_-start;

	if (start >= size_)
		return ret;

	ret.grow(length);
	ret.size_ = length;
	memcpy(ret.data_,&data_[start],length);
	return ret;
}